

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<signed_char>,ImPlot::TransformerLinLog>
               (GetterXsYs<signed_char> *getter,TransformerLinLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  char cVar4;
  ImPlotPlot *pIVar5;
  double dVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ImPlotContext *gp;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLinLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar7 = GImPlot;
  pIVar5 = GImPlot->CurrentPlot;
  if (((pIVar5->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar10 = getter->Count;
    local_48 = iVar10 + -1;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    cVar4 = getter->Xs[lVar9];
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar6 = log10((double)(int)getter->Ys[lVar9] / pIVar5->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar5 = pIVar7->CurrentPlot;
    dVar2 = pIVar5->YAxis[iVar10].Range.Min;
    IVar3 = pIVar7->PixelRange[iVar10].Min;
    local_3c.y = (float)(pIVar7->My[iVar10] *
                         (((double)(float)(dVar6 / pIVar7->LogDenY[iVar10]) *
                           (pIVar5->YAxis[iVar10].Range.Max - dVar2) + dVar2) - dVar2) +
                        (double)IVar3.y);
    local_3c.x = (float)(pIVar7->Mx * ((double)(int)cVar4 - (pIVar5->XAxis).Range.Min) +
                        (double)IVar3.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<signed_char>,ImPlot::TransformerLinLog>>
              ((LineStripRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLinLog> *)
               local_58,DrawList,&pIVar5->PlotRect);
  }
  else {
    iVar10 = getter->Count;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    cVar4 = getter->Xs[lVar9];
    dVar6 = log10((double)(int)getter->Ys[lVar9] / pIVar5->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar5 = pIVar7->CurrentPlot;
    dVar2 = pIVar5->YAxis[iVar10].Range.Min;
    IVar3 = pIVar7->PixelRange[iVar10].Min;
    local_58._4_4_ =
         (float)(pIVar7->My[iVar10] *
                 (((double)(float)(dVar6 / pIVar7->LogDenY[iVar10]) *
                   (pIVar5->YAxis[iVar10].Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar3.y);
    local_58._0_4_ =
         (float)(pIVar7->Mx * ((double)(int)cVar4 - (pIVar5->XAxis).Range.Min) + (double)IVar3.x);
    iVar10 = getter->Count;
    if (1 < iVar10) {
      iVar11 = 1;
      do {
        pIVar8 = GImPlot;
        lVar9 = (long)(((getter->Offset + iVar11) % iVar10 + iVar10) % iVar10) *
                (long)getter->Stride;
        cVar4 = getter->Xs[lVar9];
        dVar6 = log10((double)(int)getter->Ys[lVar9] /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        iVar10 = transformer->YAxis;
        pIVar5 = pIVar8->CurrentPlot;
        dVar2 = pIVar5->YAxis[iVar10].Range.Min;
        IVar3 = pIVar8->PixelRange[iVar10].Min;
        fVar12 = (float)(pIVar8->Mx * ((double)(int)cVar4 - (pIVar5->XAxis).Range.Min) +
                        (double)IVar3.x);
        fVar13 = (float)(pIVar8->My[iVar10] *
                         (((double)(float)(dVar6 / pIVar8->LogDenY[iVar10]) *
                           (pIVar5->YAxis[iVar10].Range.Max - dVar2) + dVar2) - dVar2) +
                        (double)IVar3.y);
        local_60.y = fVar13;
        local_60.x = fVar12;
        pIVar5 = pIVar7->CurrentPlot;
        fVar14 = (float)local_58._4_4_;
        if (fVar13 <= (float)local_58._4_4_) {
          fVar14 = fVar13;
        }
        if ((fVar14 < (pIVar5->PlotRect).Max.y) &&
           (fVar14 = (float)(~-(uint)(fVar13 <= (float)local_58._4_4_) & (uint)fVar13 |
                            local_58._4_4_ & -(uint)(fVar13 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar5->PlotRect).Min.y, *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
          fVar14 = (float)local_58._0_4_;
          if (fVar12 <= (float)local_58._0_4_) {
            fVar14 = fVar12;
          }
          if ((fVar14 < (pIVar5->PlotRect).Max.x) &&
             (fVar14 = (float)(-(uint)(fVar12 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar12 <= (float)local_58._0_4_) & (uint)fVar12),
             (pIVar5->PlotRect).Min.x <= fVar14 && fVar14 != (pIVar5->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar11 = iVar11 + 1;
        iVar10 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar11 < iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}